

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  Input *this_00;
  Input *__src;
  char *__src_00;
  RemoveConst<char> *pRVar1;
  Fault FVar2;
  char cVar3;
  byte bVar4;
  undefined1 *puVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  undefined1 *puVar10;
  size_t sVar11;
  Input *pIVar12;
  char *pcVar13;
  ArrayPtr<const_char16_t> utf16;
  Fault f;
  Fault f_1;
  Vector<char> local_88;
  Fault local_60;
  EncodingResult<kj::String> local_58;
  String *local_38;
  
  this_00 = &this->input;
  local_38 = __return_storage_ptr__;
  Input::consume(this_00,'\"');
  local_88.builder.ptr = (char *)0x0;
  local_88.builder.pos = (RemoveConst<char> *)0x0;
  local_88.builder.endPtr = (char *)0x0;
  do {
    __src = (Input *)(this->input).wrapped.ptr;
    pIVar12 = __src;
    if ((this->input).wrapped.size_ != 0) {
      do {
        if (((*(char *)&(pIVar12->wrapped).ptr == '\0') ||
            (cVar3 = Input::nextChar(pIVar12), cVar3 == '\"')) || (cVar3 == '\\')) break;
        Input::advance(this_00,1);
        pIVar12 = (Input *)(this->input).wrapped.ptr;
      } while ((this->input).wrapped.size_ != 0);
      pIVar12 = (Input *)(this_00->wrapped).ptr;
    }
    sVar9 = (long)pIVar12 - (long)__src;
    puVar5 = (undefined1 *)((long)local_88.builder.pos + (sVar9 - (long)local_88.builder.ptr));
    if ((undefined1 *)((long)local_88.builder.endPtr - (long)local_88.builder.ptr) < puVar5) {
      puVar10 = (undefined1 *)(((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2);
      if (local_88.builder.endPtr == local_88.builder.ptr) {
        puVar10 = (undefined1 *)0x4;
      }
      if (puVar10 < puVar5) {
        puVar10 = puVar5;
      }
      kj::Vector<char>::setCapacity(&local_88,(size_t)puVar10);
    }
    pRVar1 = local_88.builder.pos;
    if (pIVar12 != __src) {
      memcpy(local_88.builder.pos,__src,sVar9);
      local_88.builder.pos = (RemoveConst<char> *)((long)pRVar1 + sVar9);
    }
    cVar3 = Input::nextChar((Input *)(this->input).wrapped.ptr);
    if (cVar3 == '\\') {
      Input::advance(this_00,1);
      bVar4 = Input::nextChar((Input *)(this->input).wrapped.ptr);
      if (bVar4 < 0x62) {
        if (bVar4 == 0x22) {
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.pos == local_88.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar11);
          }
          *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 0x22;
        }
        else if (bVar4 == 0x2f) {
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.pos == local_88.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar11);
          }
          *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 0x2f;
        }
        else {
          if (bVar4 != 0x5c) goto switchD_001e7c3c_caseD_6f;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.pos == local_88.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar11);
          }
          *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 0x5c;
        }
      }
      else {
        switch(bVar4) {
        case 0x6e:
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.pos == local_88.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar11);
          }
          *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
switchD_001e7c3c_caseD_6f:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    ((Fault *)&local_58,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x302,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                     (char (*) [31])"Invalid escape in JSON string.");
          kj::_::Debug::Fault::fatal((Fault *)&local_58);
        case 0x72:
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.pos == local_88.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar11);
          }
          *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 0xd;
          break;
        case 0x74:
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.pos == local_88.builder.ptr) {
              sVar11 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar11);
          }
          *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 9;
          break;
        case 0x75:
          Input::consume(this_00,'u');
          pcVar13 = (this_00->wrapped).ptr;
          Input::advance(this_00,4);
          if ((long)(this_00->wrapped).ptr - (long)pcVar13 != 4) {
            local_60.exception = (Exception *)0x0;
            local_58.super_String.content.ptr = (char *)0x0;
            local_58.super_String.content.size_ = 0;
            kj::_::Debug::Fault::init
                      (&local_60,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_60);
          }
          lVar6 = 0;
          uVar8 = 0;
          do {
            FVar2.exception = local_60.exception;
            cVar3 = pcVar13[lVar6];
            utf16.size_._0_4_ = (int)cVar3;
            local_60.exception._0_1_ = cVar3;
            iVar7 = -0x30;
            if (((9 < (byte)(cVar3 - 0x30U)) && (iVar7 = -0x61, 5 < (byte)(cVar3 + 0x9fU))) &&
               (iVar7 = -0x41, 5 < (byte)(cVar3 + 0xbfU))) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                        ((Fault *)&local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                         ,0x33a,FAILED,(char *)0x0,"\"Invalid hex digit in unicode escape.\", c",
                         (char (*) [37])"Invalid hex digit in unicode escape.",(char *)&local_60);
              kj::_::Debug::Fault::fatal((Fault *)&local_58);
            }
            uVar8 = iVar7 + (int)utf16.size_ | uVar8 << 4;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          if ((int)uVar8 < 0x80) {
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
              if (local_88.builder.pos == local_88.builder.ptr) {
                sVar11 = 4;
              }
              kj::Vector<char>::setCapacity(&local_88,sVar11);
            }
            *(byte *)&((Array<char> *)local_88.builder.pos)->ptr = (byte)uVar8 & 0x7f;
            local_88.builder.pos =
                 (RemoveConst<char> *)((long)&((Array<char> *)local_88.builder.pos)->ptr + 1);
          }
          else {
            local_60.exception._2_6_ = SUB86(FVar2.exception,2);
            local_60.exception._0_2_ = (short)uVar8;
            utf16.ptr = (char16_t *)0x1;
            utf16.size_._4_4_ = 0;
            kj::decodeUtf16(&local_58,(kj *)&local_60,utf16);
            pcVar13 = local_58.super_String.content.ptr + (local_58.super_String.content.size_ - 1);
            __src_00 = local_58.super_String.content.ptr;
            if (local_58.super_String.content.size_ == 0) {
              pcVar13 = (char *)0x0;
              __src_00 = (char *)0x0;
            }
            sVar9 = (long)pcVar13 - (long)__src_00;
            puVar5 = (undefined1 *)
                     ((long)local_88.builder.pos + (sVar9 - (long)local_88.builder.ptr));
            if ((undefined1 *)((long)local_88.builder.endPtr - (long)local_88.builder.ptr) < puVar5)
            {
              puVar10 = (undefined1 *)
                        (((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2);
              if (local_88.builder.endPtr == local_88.builder.ptr) {
                puVar10 = (undefined1 *)0x4;
              }
              if (puVar10 < puVar5) {
                puVar10 = puVar5;
              }
              kj::Vector<char>::setCapacity(&local_88,(size_t)puVar10);
            }
            pRVar1 = local_88.builder.pos;
            if (__src_00 != pcVar13) {
              memcpy(local_88.builder.pos,__src_00,sVar9);
              local_88.builder.pos = (RemoveConst<char> *)((long)pRVar1 + sVar9);
            }
            sVar11 = local_58.super_String.content.size_;
            pcVar13 = local_58.super_String.content.ptr;
            if (local_58.super_String.content.ptr != (char *)0x0) {
              local_58.super_String.content.ptr = (char *)0x0;
              local_58.super_String.content.size_ = 0;
              (**(local_58.super_String.content.disposer)->_vptr_ArrayDisposer)
                        (local_58.super_String.content.disposer,pcVar13,1,sVar11,sVar11,0);
            }
          }
          goto LAB_001e7ecf;
        default:
          if (bVar4 == 0x62) {
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
              if (local_88.builder.pos == local_88.builder.ptr) {
                sVar11 = 4;
              }
              kj::Vector<char>::setCapacity(&local_88,sVar11);
            }
            *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 8;
          }
          else {
            if (bVar4 != 0x66) goto switchD_001e7c3c_caseD_6f;
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
              if (local_88.builder.pos == local_88.builder.ptr) {
                sVar11 = 4;
              }
              kj::Vector<char>::setCapacity(&local_88,sVar11);
            }
            *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 0xc;
          }
        }
      }
      local_88.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_88.builder.pos)->ptr + 1);
      Input::advance(this_00,1);
    }
LAB_001e7ecf:
    cVar3 = Input::nextChar((Input *)(this->input).wrapped.ptr);
    if (cVar3 == '\"') {
      Input::consume(this_00,'\"');
      if (local_88.builder.pos == local_88.builder.endPtr) {
        sVar11 = 4;
        if (local_88.builder.pos != local_88.builder.ptr) {
          sVar11 = ((long)local_88.builder.pos - (long)local_88.builder.ptr) * 2;
        }
        kj::Vector<char>::setCapacity(&local_88,sVar11);
      }
      *(undefined1 *)&((Array<char> *)local_88.builder.pos)->ptr = 0;
      local_88.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_88.builder.pos)->ptr + 1);
      if (local_88.builder.pos != local_88.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_88,(long)local_88.builder.pos - (long)local_88.builder.ptr);
      }
      (local_38->content).ptr = local_88.builder.ptr;
      (local_38->content).size_ = (long)local_88.builder.pos - (long)local_88.builder.ptr;
      (local_38->content).disposer = local_88.builder.disposer;
      return (String *)local_88.builder.ptr;
    }
  } while( true );
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Avoid copy / alloc if no escapes encoutered.
    // TODO(perf): Get statistics on string size and preallocate?
    kj::Vector<char> decoded;

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }